

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O1

uint16_t eia608_control_command(eia608_control_t cmd,int cc)

{
  return CONCAT11(eia608_parity_table[((cc & 1U) << 0xb | cmd & 0x7f00 | (cc & 2U) << 7) >> 8],
                  eia608_parity_table[cmd & 0x7f]);
}

Assistant:

uint16_t eia608_control_command(eia608_control_t cmd, int cc)
{
    uint16_t c = (cc & 0x01) ? 0x0800 : 0x0000;
    uint16_t f = (cc & 0x02) ? 0x0100 : 0x0000;

    if (eia608_tab_offset_0 == (eia608_control_t)(cmd & 0xFFC0)) {
        return (eia608_control_t)eia608_parity(cmd | c);
    } else {
        return (eia608_control_t)eia608_parity(cmd | c | f);
    }
}